

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  uint *puVar1;
  uint local_38;
  uint error;
  uint maxbitlen_local;
  size_t numcodes_local;
  size_t mincodes_local;
  uint *frequencies_local;
  HuffmanTree *tree_local;
  
  for (_error = numcodes; frequencies[_error - 1] == 0 && mincodes < _error; _error = _error - 1) {
  }
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (uint)_error;
  puVar1 = (uint *)lodepng_realloc(tree->lengths,_error << 2);
  tree->lengths = puVar1;
  if (tree->lengths == (uint *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    memset(tree->lengths,0,_error << 2);
    local_38 = lodepng_huffman_code_lengths(tree->lengths,frequencies,_error,maxbitlen);
    if (local_38 == 0) {
      local_38 = HuffmanTree_makeFromLengths2(tree);
    }
    tree_local._4_4_ = local_38;
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  memset(tree->lengths, 0, numcodes * sizeof(unsigned));

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}